

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::TraceDependencies(cmLocalGenerator *this)

{
  cmTarget *pcVar1;
  _Rb_tree_node_base *p_Var2;
  pointer config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmGeneratorTargetsType targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined1 local_60 [48];
  string local_30;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_30,this->Makefile,&local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
  }
  config = local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmGlobalGenerator::CreateEvaluationSourceFiles(this->GlobalGenerator,config);
      config = config + 1;
    } while (config != local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::_Rb_tree((_Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
              *)local_60,&(this->Makefile->GeneratorTargets)._M_t);
  for (p_Var2 = (_Rb_tree_node_base *)local_60._24_8_;
      p_Var2 != (_Rb_tree_node_base *)(local_60 + 8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pcVar1 = ((cmGeneratorTarget *)p_Var2[1]._M_parent)->Target;
    if ((pcVar1->IsImportedTarget == false) && (pcVar1->TargetTypeValue != INTERFACE_LIBRARY)) {
      cmGeneratorTarget::TraceDependencies((cmGeneratorTarget *)p_Var2[1]._M_parent);
    }
  }
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree((_Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
               *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void cmLocalGenerator::TraceDependencies()
{
  std::vector<std::string> configs;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty())
    {
    configs.push_back("");
    }
  for(std::vector<std::string>::const_iterator ci = configs.begin();
      ci != configs.end(); ++ci)
    {
    this->GlobalGenerator->CreateEvaluationSourceFiles(*ci);
    }
  // Generate the rule files for each target.
  cmGeneratorTargetsType targets = this->Makefile->GetGeneratorTargets();
  for(cmGeneratorTargetsType::iterator t = targets.begin();
      t != targets.end(); ++t)
    {
    if (t->second->Target->IsImported()
        || t->second->Target->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    t->second->TraceDependencies();
    }
}